

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_protective_shield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    bVar1 = is_affected_by(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                    CONCAT24(in_stack_ffffffffffffff94,
                                             CONCAT22(in_stack_ffffffffffffff92,
                                                      in_stack_ffffffffffffff90))),
                   in_stack_ffffffffffffff88);
    }
    else {
      init_affect((AFFECT_DATA *)0x61df14);
      uVar3 = 0;
      get_spell_aftype(in_stack_ffffffffffffff78);
      uVar2 = (undefined2)in_EDI;
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (AFFECT_DATA *)in_stack_ffffffffffffff78);
      act((char *)CONCAT26(in_SI,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffff90))),
          in_stack_ffffffffffffff88,
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          in_stack_ffffffffffffff78,0);
      send_to_char((char *)CONCAT26(in_SI,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffff90)))
                   ,in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void spell_protective_shield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already protected by a protective shield.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_RAGE))
	{
		send_to_char("You cannot concentrate enough to maintain a protective shield while in a rage.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.location = 0;
	af.modifier = 0;
	af.duration = 5 + level / 5;
	af.type = sn;
	af.level = level;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	act("$n is surrounded by a protective shield.", ch, 0, 0, TO_ROOM);
	send_to_char("You are surrounded by a protective shield.\n\r", ch);
}